

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O1

bool __thiscall OpenMD::RigidBody::getAtomRefCoor(RigidBody *this,Vector3d *coor,uint index)

{
  Vector3d *pVVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)index;
  uVar3 = (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar4 < uVar3) {
    pVVar1 = (this->refCoords_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar4;
    if (pVVar1 != coor) {
      lVar2 = 0;
      do {
        (coor->super_Vector<double,_3U>).data_[lVar2] =
             (pVVar1->super_Vector<double,_3U>).data_[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
    }
  }
  else {
    snprintf(painCave.errMsg,2000,
             "Index %d is an invalid index, the current rigid body contains %zu atoms.\n",
             (ulong)index,uVar3);
    painCave.isFatal = 0;
    simError();
  }
  return uVar4 < uVar3;
}

Assistant:

bool RigidBody::getAtomRefCoor(Vector3d& coor, unsigned int index) {
    if (index < atoms_.size()) {
      coor = refCoords_[index];
      return true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Index %d is an invalid index, the current rigid body contains %zu "
          "atoms.\n",
          index, atoms_.size());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }